

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

void SuperSpread_Test_Hitter<4u>(string *PATH)

{
  undefined8 *puVar1;
  size_type *psVar2;
  key_type *__k;
  char *pcVar3;
  code *pcVar4;
  Abstract<4U> *this;
  undefined8 uVar5;
  bool bVar6;
  char cVar7;
  undefined1 *puVar8;
  size_type *psVar9;
  __node_base_ptr p_Var10;
  Data<4U> *__ptr;
  undefined8 *puVar11;
  value_type *__val;
  void *pvVar12;
  long *plVar13;
  WavingSketch<8U,_16U,_4U> *this_00;
  TLF<4U> *this_01;
  OLF<4U> *this_02;
  OpenSketch<4U> *this_03;
  SpreadSketchWrapper<4U> *this_04;
  ostream *poVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  iterator iVar17;
  mapped_type *pmVar18;
  size_type *psVar19;
  __hashtable_alloc *p_Var20;
  basic_ostream<char,_std::char_traits<char>_> **out_3;
  undefined8 *puVar21;
  undefined8 *puVar22;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  *p_Var23;
  ulong uVar24;
  uint32_t j;
  long lVar25;
  int iVar26;
  basic_ostream<char,_std::char_traits<char>_> **out_1;
  undefined8 *puVar27;
  long lVar28;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
  local_358;
  ofstream out;
  long local_348;
  long lStack_340;
  ios_base local_260 [264];
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_158;
  undefined1 *local_120;
  string *local_118;
  __hashtable_alloc *local_110;
  undefined8 local_108;
  ulong local_100;
  size_type *local_f8;
  string file;
  Data<4U> from;
  undefined1 local_b8 [8];
  HashMap<4U> mp;
  int local_78;
  undefined4 local_74;
  int cnt;
  Data<4U> to;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  __node_base_ptr p_Stack_38;
  
  local_118 = PATH;
  _from = (undefined8 *)operator_new(0x20);
  puVar1 = _from + 4;
  *_from = 0;
  _from[1] = 0;
  _from[2] = 0;
  _from[3] = 0;
  local_f8 = &file._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"caida","");
  pvVar12 = operator_new(0x200);
  local_68 = (undefined1  [8])&__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append(local_68);
  plVar13 = (long *)std::__cxx11::string::_M_append(local_68,(ulong)local_f8);
  psVar2 = &mp._M_h._M_bucket_count;
  psVar19 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar19) {
    mp._M_h._M_bucket_count = *psVar19;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar13[3];
    local_b8 = (undefined1  [8])psVar2;
  }
  else {
    mp._M_h._M_bucket_count = *psVar19;
    local_b8 = (undefined1  [8])*plVar13;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar13[1];
  *plVar13 = (long)psVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_b8);
  p_Var20 = (__hashtable_alloc *)(plVar13 + 2);
  if ((__hashtable_alloc *)*plVar13 == p_Var20) {
    local_348 = *(long *)p_Var20;
    lStack_340 = plVar13[3];
    local_358._M_h = (__hashtable_alloc *)&local_348;
  }
  else {
    local_348 = *(long *)p_Var20;
    local_358._M_h = (__hashtable_alloc *)*plVar13;
  }
  _out = plVar13[1];
  *plVar13 = (long)p_Var20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(pvVar12,(string *)&local_358,_S_out);
  *_from = pvVar12;
  if (local_358._M_h != (__hashtable_alloc *)&local_348) {
    operator_delete(local_358._M_h,local_348 + 1);
  }
  if (local_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_b8,mp._M_h._M_bucket_count + 1);
  }
  if (local_68 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_68,__str._M_string_length + 1);
  }
  pvVar12 = operator_new(0x200);
  local_68 = (undefined1  [8])&__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append(local_68);
  plVar13 = (long *)std::__cxx11::string::_M_append(local_68,(ulong)local_f8);
  psVar19 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar19) {
    mp._M_h._M_bucket_count = *psVar19;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar13[3];
    local_b8 = (undefined1  [8])psVar2;
  }
  else {
    mp._M_h._M_bucket_count = *psVar19;
    local_b8 = (undefined1  [8])*plVar13;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar13[1];
  *plVar13 = (long)psVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_b8);
  p_Var20 = (__hashtable_alloc *)(plVar13 + 2);
  if ((__hashtable_alloc *)*plVar13 == p_Var20) {
    local_348 = *(long *)p_Var20;
    lStack_340 = plVar13[3];
    local_358._M_h = (__hashtable_alloc *)&local_348;
  }
  else {
    local_348 = *(long *)p_Var20;
    local_358._M_h = (__hashtable_alloc *)*plVar13;
  }
  _out = plVar13[1];
  *plVar13 = (long)p_Var20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(pvVar12,(string *)&local_358,_S_out);
  _from[1] = pvVar12;
  if (local_358._M_h != (__hashtable_alloc *)&local_348) {
    operator_delete(local_358._M_h,local_348 + 1);
  }
  if (local_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_b8,mp._M_h._M_bucket_count + 1);
  }
  if (local_68 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_68,__str._M_string_length + 1);
  }
  pvVar12 = operator_new(0x200);
  local_68 = (undefined1  [8])&__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append(local_68);
  plVar13 = (long *)std::__cxx11::string::_M_append(local_68,(ulong)local_f8);
  psVar19 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar19) {
    mp._M_h._M_bucket_count = *psVar19;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar13[3];
    local_b8 = (undefined1  [8])psVar2;
  }
  else {
    mp._M_h._M_bucket_count = *psVar19;
    local_b8 = (undefined1  [8])*plVar13;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar13[1];
  *plVar13 = (long)psVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_b8);
  p_Var20 = (__hashtable_alloc *)(plVar13 + 2);
  if ((__hashtable_alloc *)*plVar13 == p_Var20) {
    local_348 = *(long *)p_Var20;
    lStack_340 = plVar13[3];
    local_358._M_h = (__hashtable_alloc *)&local_348;
  }
  else {
    local_348 = *(long *)p_Var20;
    local_358._M_h = (__hashtable_alloc *)*plVar13;
  }
  _out = plVar13[1];
  *plVar13 = (long)p_Var20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(pvVar12,(string *)&local_358,_S_out);
  _from[2] = pvVar12;
  if (local_358._M_h != (__hashtable_alloc *)&local_348) {
    operator_delete(local_358._M_h,local_348 + 1);
  }
  if (local_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_b8,mp._M_h._M_bucket_count + 1);
  }
  if (local_68 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_68,__str._M_string_length + 1);
  }
  pvVar12 = operator_new(0x200);
  local_68 = (undefined1  [8])&__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p,
             RESULT_FOLDER_abi_cxx11_._M_dataplus._M_p + RESULT_FOLDER_abi_cxx11_._M_string_length);
  std::__cxx11::string::append(local_68);
  plVar13 = (long *)std::__cxx11::string::_M_append(local_68,(ulong)local_f8);
  psVar19 = (size_type *)(plVar13 + 2);
  if ((size_type *)*plVar13 == psVar19) {
    mp._M_h._M_bucket_count = *psVar19;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)plVar13[3];
    local_b8 = (undefined1  [8])psVar2;
  }
  else {
    mp._M_h._M_bucket_count = *psVar19;
    local_b8 = (undefined1  [8])*plVar13;
  }
  mp._M_h._M_buckets = (__buckets_ptr)plVar13[1];
  *plVar13 = (long)psVar19;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append(local_b8);
  p_Var20 = (__hashtable_alloc *)(plVar13 + 2);
  if ((__hashtable_alloc *)*plVar13 == p_Var20) {
    local_348 = *(long *)p_Var20;
    lStack_340 = plVar13[3];
    local_358._M_h = (__hashtable_alloc *)&local_348;
  }
  else {
    local_348 = *(long *)p_Var20;
    local_358._M_h = (__hashtable_alloc *)*plVar13;
  }
  _out = plVar13[1];
  *plVar13 = (long)p_Var20;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  std::ofstream::ofstream(pvVar12,(string *)&local_358,_S_out);
  _from[3] = pvVar12;
  if (local_358._M_h != (__hashtable_alloc *)&local_348) {
    operator_delete(local_358._M_h,local_348 + 1);
  }
  if (local_b8 != (undefined1  [8])psVar2) {
    operator_delete((void *)local_b8,mp._M_h._M_bucket_count + 1);
  }
  if (local_68 != (undefined1  [8])&__str._M_string_length) {
    operator_delete((void *)local_68,__str._M_string_length + 1);
  }
  local_110 = _VTT;
  local_108 = _log;
  __k = (key_type *)(&file.field_2._M_allocated_capacity + 1);
  iVar26 = 0;
  p_Var23 = &local_358;
  do {
    mp._M_h._M_single_bucket = (__node_base_ptr)(ulong)(iVar26 * 100000 + 600000);
    local_100 = (ulong)mp._M_h._M_single_bucket / 1000;
    *(undefined8 *)((long)p_Var23 + -8) = 0x107b84;
    printf("\x1b[0m\x1b[1;4;36m> Memory size: %dKB\n\x1b[0m");
    puVar21 = (undefined8 *)((long)p_Var23 + -0x30);
    local_120 = (undefined1 *)p_Var23;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107b9f;
    this_00 = (WavingSketch<8U,_16U,_4U> *)operator_new(0xa8);
    p_Var10 = mp._M_h._M_single_bucket;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107bb8;
    WavingSketch<8U,_16U,_4U>::WavingSketch(this_00,(int)p_Var10,0x54,3);
    *puVar21 = this_00;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107bc5;
    this_01 = (TLF<4U> *)operator_new(0x120);
    p_Var10 = mp._M_h._M_single_bucket;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107bd9;
    TLF<4U>::TLF(this_01,(int)p_Var10,0x54);
    *(TLF<4U> **)((long)p_Var23 + -0x28) = this_01;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107be7;
    this_02 = (OLF<4U> *)operator_new(0xe8);
    p_Var10 = mp._M_h._M_single_bucket;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107bfb;
    OLF<4U>::OLF(this_02,(int)p_Var10,0x54);
    *(OLF<4U> **)((long)p_Var23 + -0x20) = this_02;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107c09;
    this_03 = (OpenSketch<4U> *)operator_new(0xd0);
    p_Var10 = mp._M_h._M_single_bucket;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107c1d;
    OpenSketch<4U>::OpenSketch(this_03,(int)p_Var10,0x54);
    *(OpenSketch<4U> **)((long)p_Var23 + -0x18) = this_03;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107c2b;
    this_04 = (SpreadSketchWrapper<4U> *)operator_new(0x78);
    p_Var10 = mp._M_h._M_single_bucket;
    file.field_2._12_4_ = iVar26;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107c46;
    SpreadSketchWrapper<4U>::SpreadSketchWrapper(this_04,(int)p_Var10,0x54);
    *(SpreadSketchWrapper<4U> **)((long)p_Var23 + -0x10) = this_04;
    uVar24 = local_100;
    puVar22 = _from;
    puVar11 = puVar1;
    if (file.field_2._12_4_ == 0) {
      puVar27 = _from;
      _cnt = (Data<4U> *)puVar1;
      if (_from != puVar1) {
        do {
          poVar14 = (ostream *)*puVar27;
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107c91;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"MEM(KB)",7);
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107ca5;
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          lVar28 = 0;
          do {
            poVar14 = (ostream *)*puVar27;
            pcVar3 = *(char **)(puVar21[lVar28] + 8);
            lVar25 = *(long *)(puVar21[lVar28] + 0x10);
            *(undefined8 *)((long)p_Var23 + -0x38) = 0x107cbc;
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar3,lVar25);
            *(undefined8 *)((long)p_Var23 + -0x38) = 0x107cd0;
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
            lVar28 = lVar28 + 1;
          } while (lVar28 != 5);
          uVar5 = *(undefined8 *)(*(long *)*puVar27 + -0x18);
          cVar7 = (char)(long *)*puVar27;
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107cf1;
          std::ios::widen((char)uVar5 + cVar7);
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107cfc;
          std::ostream::put(cVar7);
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107d04;
          std::ostream::flush();
          puVar27 = puVar27 + 1;
          uVar24 = local_100;
          puVar22 = _from;
        } while ((Data<4U> *)puVar27 != _cnt);
        goto LAB_00107d50;
      }
    }
    else {
LAB_00107d50:
      for (; _cnt = (Data<4U> *)puVar11, (Data<4U> *)puVar22 != _cnt; puVar22 = puVar22 + 1) {
        poVar14 = (ostream *)*puVar22;
        *(undefined8 *)((long)p_Var23 + -0x38) = 0x107d38;
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,(int)uVar24);
        *(undefined8 *)((long)p_Var23 + -0x38) = 0x107d4c;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
        puVar11 = (undefined8 *)_cnt;
      }
    }
    local_b8 = (undefined1  [8])&mp._M_h._M_rehash_policy._M_next_resize;
    mp._M_h._M_buckets = (__buckets_ptr)0x1;
    mp._M_h._M_bucket_count = 0;
    mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    mp._M_h._M_element_count._0_4_ = 1.0;
    mp._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    mp._M_h._M_rehash_policy._4_4_ = 0;
    mp._M_h._M_rehash_policy._M_next_resize = 0;
    local_68 = (undefined1  [8])&p_Stack_38;
    __str._M_dataplus._M_p = (pointer)0x1;
    __str._M_string_length = 0;
    __str.field_2._M_allocated_capacity = 0;
    __str.field_2._8_4_ = 0x3f800000;
    p_Stack_38 = (__node_base_ptr)0x0;
    pcVar3 = (local_118->_M_dataplus)._M_p;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107dc1;
    _cnt = read_standard_pair_data<4u>(pcVar3,record_length,&local_78);
    file.field_2._8_4_ = 0;
    local_74 = 0;
    iVar26 = 10000000;
    if (local_78 < 10000000) {
      iVar26 = local_78;
    }
    bVar6 = 0 < local_78;
    local_78 = iVar26;
    if (bVar6) {
      lVar28 = 0;
      do {
        file.field_2._8_4_ = *(undefined4 *)_cnt[lVar28 * 2].str;
        local_74 = *(undefined4 *)_cnt[lVar28 * 2 + 1].str;
        local_358._M_h._4_4_ = local_74;
        local_358._M_h._0_4_ = file.field_2._8_4_;
        *(undefined8 *)((long)p_Var23 + -0x38) = 0x107e1d;
        iVar15 = std::
                 _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_68,(key_type *)&local_358);
        if (iVar15.super__Node_iterator_base<std::pair<const_Stream<4U>,_int>,_true>._M_cur ==
            (__node_type *)0x0) {
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107e32;
          pmVar16 = std::__detail::
                    _Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_68,(key_type *)&local_358);
          *pmVar16 = 1;
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107e47;
          iVar17 = std::
                   _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_b8,__k);
          if (iVar17.super__Node_iterator_base<std::pair<const_Data<4U>,_int>,_true>._M_cur ==
              (__node_type *)0x0) {
            *(undefined8 *)((long)p_Var23 + -0x38) = 0x107e6e;
            pmVar18 = std::__detail::
                      _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_b8,__k);
            *pmVar18 = 1;
          }
          else {
            *(undefined8 *)((long)p_Var23 + -0x38) = 0x107e5b;
            pmVar18 = std::__detail::
                      _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_b8,__k);
            *pmVar18 = *pmVar18 + 1;
          }
        }
        lVar25 = 0;
        do {
          plVar13 = (long *)puVar21[lVar25];
          pcVar4 = *(code **)(*plVar13 + 0x28);
          *(undefined8 *)((long)p_Var23 + -0x38) = 0x107e87;
          (*pcVar4)(plVar13,__k,&local_74);
          lVar25 = lVar25 + 1;
        } while (lVar25 != 5);
        lVar28 = lVar28 + 1;
      } while (lVar28 < local_78);
    }
    __ptr = _cnt;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107ea9;
    free(__ptr);
    lVar28 = 0;
    do {
      plVar13 = (long *)puVar21[lVar28];
      local_158._M_buckets = (__buckets_ptr)0x0;
      local_158._M_bucket_count = (size_type)mp._M_h._M_buckets;
      local_158._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_158._M_element_count = (size_type)mp._M_h._M_before_begin._M_nxt;
      local_158._M_rehash_policy._4_4_ = mp._M_h._M_element_count._4_4_;
      local_158._M_rehash_policy._M_max_load_factor = (float)mp._M_h._M_element_count;
      local_158._M_rehash_policy._M_next_resize = mp._M_h._M_rehash_policy._0_8_;
      local_158._M_single_bucket = (__node_base_ptr)0x0;
      local_358._M_h = (__hashtable_alloc *)&local_158;
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107f1b;
      std::
      _Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<Data<4u>const,int>,true>>>>
                ((_Hashtable<Data<4u>,std::pair<Data<4u>const,int>,std::allocator<std::pair<Data<4u>const,int>>,std::__detail::_Select1st,std::equal_to<Data<4u>>,My_Hash<4u>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_158,
                 (_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_b8,&local_358);
      pcVar4 = *(code **)(*plVar13 + 0x30);
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107f2f;
      (*pcVar4)(plVar13,&local_158,&from);
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107f37;
      std::
      _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_158);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 5);
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x107f50;
    std::ofstream::ofstream(&local_358);
    lVar28 = 0;
    do {
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107f65;
      printf("\x1b[0m\x1b[1;36m|\x1b[0m\t");
      p_Var10 = mp._M_h._M_single_bucket;
      this = (Abstract<4U> *)puVar21[lVar28];
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107f79;
      Abstract<4U>::print_f1(this,(ofstream *)&local_358,(int)p_Var10);
      lVar28 = lVar28 + 1;
    } while (lVar28 != 5);
    lVar28 = 0;
    do {
      if ((long *)puVar21[lVar28] != (long *)0x0) {
        pcVar4 = *(code **)(*(long *)puVar21[lVar28] + 0x48);
        *(undefined8 *)((long)p_Var23 + -0x38) = 0x107f94;
        (*pcVar4)();
      }
      lVar28 = lVar28 + 1;
      puVar22 = _from;
    } while (lVar28 != 5);
    for (; puVar22 != puVar1; puVar22 = puVar22 + 1) {
      uVar5 = *(undefined8 *)(*(long *)*puVar22 + -0x18);
      cVar7 = (char)(long *)*puVar22;
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107fc8;
      std::ios::widen((char)uVar5 + cVar7);
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107fd3;
      std::ostream::put(cVar7);
      *(undefined8 *)((long)p_Var23 + -0x38) = 0x107fdb;
      std::ostream::flush();
    }
    local_358._M_h = local_110;
    *(undefined8 *)((long)&local_358._M_h + *(long *)(local_110 + -0x18)) = local_108;
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x10800e;
    std::filebuf::~filebuf((filebuf *)&out);
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x10801a;
    std::ios_base::~ios_base(local_260);
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x108023;
    std::
    _Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Stream<4U>,_std::pair<const_Stream<4U>,_int>,_std::allocator<std::pair<const_Stream<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Stream<4U>_>,_Stream_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_68);
    *(undefined8 *)((long)p_Var23 + -0x38) = 0x10802f;
    std::
    _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_b8);
    psVar9 = local_f8;
    puVar8 = local_120;
    iVar26 = file.field_2._12_4_ + 1;
    p_Var23 = (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_Data<4U>,_int>,_true>_>_>
               *)local_120;
    if (iVar26 == 5) {
      if (local_f8 != &file._M_string_length) {
        *(undefined8 *)(local_120 + -8) = 0x10806c;
        operator_delete(psVar9,file._M_string_length + 1);
      }
      puVar22 = _from;
      if (_from != (undefined8 *)0x0) {
        uVar24 = (long)puVar1 - (long)_from;
        *(undefined8 *)(puVar8 + -8) = 0x108087;
        operator_delete(puVar22,uVar24);
      }
      return;
    }
  } while( true );
}

Assistant:

void SuperSpread_Test_Hitter(string PATH) {
	std::vector<std::ostream*> outs(4);
	std::string file = "caida";
	outs[0] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_ARE.csv");
	outs[1] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Recall Rate (RR).csv");
	outs[2] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_Precision Rate (PR).csv");
	outs[3] = new std::ofstream(RESULT_FOLDER + "superSpread_" + file + "_F1.csv");
	for (int i = 0; i < 5; ++i) {
		int memory = 6 * SuperSpread_BLOCK + SuperSpread_BLOCK * i;
		printf("\033[0m\033[1;4;36m> Memory size: %dKB\n\033[0m", memory / 1000);
		int SKETCH_NUM = 5;
		Abstract<DATA_LEN>* sketch[SKETCH_NUM];
		sketch[0] = new WavingSketch<8, 16, DATA_LEN>(memory, SuperSpread_HIT);
		sketch[1] = new TLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[2] = new OLF<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[3] = new OpenSketch<DATA_LEN>(memory, SuperSpread_HIT);
		sketch[4] = new SpreadSketchWrapper<DATA_LEN>(memory, SuperSpread_HIT);

		if (i == 0)
		{
			for (auto& out : outs)
			{
				*out << "MEM(KB)" << ",";
				for (uint32_t j = 0; j < SKETCH_NUM; j++)
				{
					*out << sketch[j]->name << ",";
				}
				*out << std::endl;
			}
		}
		for (auto& out : outs)
		{
			*out << memory / 1000 << ",";
		}

		HashMap<DATA_LEN> mp;
		StreamMap<DATA_LEN> sp;

		int cnt;
		Data<DATA_LEN>* records = read_standard_pair_data<DATA_LEN>(PATH.c_str(), record_length, &cnt);
		Data<DATA_LEN> from;
		Data<DATA_LEN> to;
		int num = 0;
		cnt = std::min(cnt, MAX_PACKET);
		while (num < cnt) {
			from = records[num * 2];
			to = records[num * 2 + 1];

			/*
			num++;
			if(num % 1000000 == 0){
				cout << num << endl;
			}
			*/

			Stream<DATA_LEN> stream(from, to);
			if (sp.find(stream) == sp.end()) {
				sp[stream] = 1;
				if (mp.find(from) == mp.end())
					mp[from] = 1;
				else
					mp[from] += 1;
			}
			for (int j = 0; j < SKETCH_NUM; ++j) {
				sketch[j]->Init(from, to);
			}
			num++;
		}
		free(records);
		for (int j = 0; j < SKETCH_NUM; ++j) {
			sketch[j]->Check(mp, outs);
		}

		ofstream out;

		for (int j = 0; j < SKETCH_NUM; ++j) {
			printf("\033[0m\033[1;36m|\033[0m\t");
			sketch[j]->print_f1(out, memory);
		}

		for (int j = 0; j < SKETCH_NUM; ++j) {
			delete sketch[j];
		}
		for (auto& out : outs)
		{
			*out << std::endl;
		}
	}
}